

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

_Bool is_sasl_mechanisms_type_by_descriptor(AMQP_VALUE descriptor)

{
  int iVar1;
  uint64_t local_20;
  uint64_t descriptor_ulong;
  AMQP_VALUE pAStack_10;
  _Bool result;
  AMQP_VALUE descriptor_local;
  
  pAStack_10 = descriptor;
  iVar1 = amqpvalue_get_ulong(descriptor,&local_20);
  if ((iVar1 == 0) && (local_20 == 0x40)) {
    descriptor_ulong._7_1_ = true;
  }
  else {
    descriptor_ulong._7_1_ = false;
  }
  return descriptor_ulong._7_1_;
}

Assistant:

bool is_sasl_mechanisms_type_by_descriptor(AMQP_VALUE descriptor)
{
    bool result;

    uint64_t descriptor_ulong;
    if ((amqpvalue_get_ulong(descriptor, &descriptor_ulong) == 0) &&
        (descriptor_ulong == 64))
    {
        result = true;
    }
    else
    {
        result = false;
    }

    return result;
}